

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_srem(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *b_00;
  BtorSimBitVector *pBVar1;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *__ptr_01;
  BtorSimBitVector *__ptr_02;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_01;
  uint32_t uVar2;
  BtorSimBitVector *pBVar3;
  BtorSimBitVector *pBVar4;
  BtorSimBitVector *res;
  BtorSimBitVector *local_38;
  
  if (a->width == 1) {
    b_00 = btorsim_bv_not(b);
    pBVar1 = btorsim_bv_and(a,b_00);
  }
  else {
    uVar2 = a->width - 1;
    __ptr = btorsim_bv_slice(a,uVar2,uVar2);
    uVar2 = b->width - 1;
    __ptr_00 = btorsim_bv_slice(b,uVar2,uVar2);
    __ptr_01 = btorsim_bv_neg(a);
    __ptr_02 = btorsim_bv_neg(b);
    uVar2 = __ptr->width;
    if ((uVar2 != 1) || (pBVar3 = __ptr_01, ((&__ptr[1].width)[__ptr->len - 1] & 1) == 0)) {
      pBVar3 = a;
    }
    a_00 = btorsim_bv_new(pBVar3->width);
    memcpy(a_00 + 1,pBVar3 + 1,(ulong)pBVar3->len << 2);
    if ((__ptr_00->width != 1) ||
       (pBVar3 = __ptr_02, ((&__ptr_00[1].width)[__ptr_00->len - 1] & 1) == 0)) {
      pBVar3 = b;
    }
    b_01 = btorsim_bv_new(pBVar3->width);
    memcpy(b_01 + 1,pBVar3 + 1,(ulong)pBVar3->len << 2);
    local_38 = (BtorSimBitVector *)0x0;
    udiv_urem_bv(a_00,b_01,(BtorSimBitVector **)0x0,&local_38);
    pBVar3 = local_38;
    b_00 = btorsim_bv_neg(local_38);
    if ((uVar2 != 1) || (pBVar4 = b_00, ((&__ptr[1].width)[__ptr->len - 1] & 1) == 0)) {
      pBVar4 = pBVar3;
    }
    pBVar1 = btorsim_bv_new(pBVar4->width);
    memcpy(pBVar1 + 1,pBVar4 + 1,(ulong)pBVar4->len << 2);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    free(a_00);
    free(b_01);
    free(pBVar3);
  }
  free(b_00);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_srem (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    /* normalize a and b if necessary */
    cond_a   = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_a)
                                           : btorsim_bv_copy (a);
    cond_b   = btorsim_bv_is_true (sign_b) ? btorsim_bv_copy (neg_b)
                                           : btorsim_bv_copy (b);
    urem     = btorsim_bv_urem (cond_a, cond_b);
    neg_urem = btorsim_bv_neg (urem);
    res      = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_urem)
                                           : btorsim_bv_copy (urem);
    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}